

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hpp
# Opt level: O0

void process_command_line_arguments(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  long lVar5;
  char *port_sep;
  char *main_sep;
  int option_index;
  int c;
  option long_options [15];
  uint local_1c;
  char **ppcStack_18;
  int flags;
  char **argv_local;
  int argc_local;
  
  _option_index = "start";
  long_options[0].name._0_4_ = 0;
  long_options[0].has_arg = 0;
  long_options[0]._12_4_ = 0;
  long_options[0].flag._0_4_ = 0x73;
  long_options[0]._24_8_ = (long)"us-keymap" + 3;
  long_options[1].name._0_4_ = 1;
  long_options[1].has_arg = 0;
  long_options[1]._12_4_ = 0;
  long_options[1].flag._0_4_ = 0x6d;
  long_options[1]._24_8_ = anon_var_dwarf_1bbd;
  long_options[2].name._0_4_ = 1;
  long_options[2].has_arg = 0;
  long_options[2]._12_4_ = 0;
  long_options[2].flag._0_4_ = 0x6f;
  long_options[2]._24_8_ = anon_var_dwarf_1bc7;
  long_options[3].name._0_4_ = 0;
  long_options[3].has_arg = 0;
  long_options[3]._12_4_ = 0;
  long_options[3].flag._0_4_ = 0x75;
  long_options[3]._24_8_ = anon_var_dwarf_1bdd;
  long_options[4].name._0_4_ = 0;
  long_options[4].has_arg = 0;
  long_options[4]._12_4_ = 0;
  long_options[4].flag._0_4_ = 0x6b;
  long_options[4]._24_8_ = anon_var_dwarf_1bf3;
  long_options[5].name._0_4_ = 1;
  long_options[5].has_arg = 0;
  long_options[5]._12_4_ = 0;
  long_options[5].flag._0_4_ = 100;
  long_options[5]._24_8_ = anon_var_dwarf_1bfd;
  long_options[6].name._0_4_ = 0;
  long_options[6].has_arg = 0;
  long_options[6]._12_4_ = 0;
  long_options[6].flag._0_4_ = 0x3f;
  long_options[6]._24_8_ = anon_var_dwarf_1c07;
  long_options[7].name._0_4_ = 1;
  long_options[7]._8_8_ = &local_1c;
  long_options[7].flag._0_4_ = 1;
  long_options[7]._24_8_ = anon_var_dwarf_1c1d;
  long_options[8].name._0_4_ = 0;
  long_options[8]._8_8_ = &local_1c;
  long_options[8].flag._0_4_ = 2;
  long_options[8]._24_8_ = anon_var_dwarf_1c33;
  long_options[9].name._0_4_ = 0;
  long_options[9]._8_8_ = &local_1c;
  long_options[9].flag._0_4_ = 4;
  long_options[9]._24_8_ = anon_var_dwarf_1c3d;
  long_options[10].name._0_4_ = 1;
  long_options[10]._8_8_ = &local_1c;
  long_options[10].flag._0_4_ = 8;
  long_options[10]._24_8_ = anon_var_dwarf_1c47;
  long_options[0xb].name._0_4_ = 1;
  long_options[0xb]._8_8_ = &local_1c;
  long_options[0xb].flag._0_4_ = 0x10;
  long_options[0xb]._24_8_ = anon_var_dwarf_1c5d;
  long_options[0xc].name._0_4_ = 1;
  long_options[0xc]._8_8_ = &local_1c;
  long_options[0xc].flag._0_4_ = 0x20;
  long_options[0xc]._24_8_ = anon_var_dwarf_1c67;
  long_options[0xd].name._0_4_ = 0;
  long_options[0xd]._8_8_ = &local_1c;
  long_options[0xd].flag._0_4_ = 0x40;
  ppcStack_18 = argv;
  argv_local._4_4_ = argc;
  memset(&long_options[0xd].val,0,0x20);
  while( true ) {
    while( true ) {
      main_sep._4_4_ =
           getopt_long(argv_local._4_4_,ppcStack_18,"sm:o:ukd:?",&option_index,&main_sep);
      if (main_sep._4_4_ == -1) {
        main_sep._4_4_ = 0xffffffff;
        while (_optind < argv_local._4_4_) {
          lVar5 = (long)_optind;
          _optind = _optind + 1;
          error(0,0,"Non-option argument %s",ppcStack_18[lVar5]);
        }
        return;
      }
      if (main_sep._4_4_ != 0) break;
      args.flags = args.flags | local_1c;
      switch(local_1c) {
      case 1:
        std::__cxx11::string::operator=((string *)&args.keymap,_optarg);
        break;
      case 8:
        iVar1 = strncmp(_optarg,"http://",7);
        if (iVar1 != 0) {
          error(1,0,"HTTP URL must be like \"http://domain:port/script\"");
        }
        std::__cxx11::string::operator=((string *)&args.http_url,_optarg);
        break;
      case 0x10:
        pcVar2 = strrchr(_optarg,0x40);
        pcVar3 = strrchr(_optarg,0x3a);
        if ((pcVar2 == (char *)0x0) || (pcVar3 == (char *)0x0)) {
          error(1,0,"Invalid IRC FORMAT! Must be: nick_or_channel@server:port. See manual!");
        }
        *pcVar2 = '\0';
        *pcVar3 = '\0';
        std::__cxx11::string::operator=((string *)&args.irc_entity,_optarg);
        std::__cxx11::string::operator=((string *)&args.irc_server,pcVar2 + 1);
        std::__cxx11::string::operator=((string *)&args.irc_port,pcVar3 + 1);
        break;
      case 0x20:
        iVar1 = atoi(_optarg);
        pcVar2 = _optarg;
        args.post_size = (off_t)iVar1;
        sVar4 = strlen(_optarg);
        switch(pcVar2[sVar4 - 1]) {
        case 'K':
        case 'k':
          args.post_size = args.post_size * 1000;
          break;
        case 'M':
        case 'm':
          args.post_size = args.post_size * 1000000;
        }
      }
    }
    if (main_sep._4_4_ == 0x3f) break;
    if (main_sep._4_4_ == 100) {
      std::__cxx11::string::operator=((string *)&args.device,_optarg);
    }
    else if (main_sep._4_4_ == 0x6b) {
      args.kill = true;
    }
    else if (main_sep._4_4_ == 0x6d) {
      std::__cxx11::string::operator=((string *)&args.keymap,_optarg);
    }
    else if (main_sep._4_4_ == 0x6f) {
      std::__cxx11::string::operator=((string *)&args.logfile,_optarg);
    }
    else if (main_sep._4_4_ == 0x73) {
      args.start = true;
    }
    else {
      if (main_sep._4_4_ != 0x75) {
        usage();
        exit(1);
      }
      args.us_keymap = true;
    }
  }
  usage();
  exit(0);
}

Assistant:

void process_command_line_arguments(int argc, char **argv)
{
    int flags;

    struct option long_options[] = {
        {"start",     no_argument,       0, 's'},
        {"keymap",    required_argument, 0, 'm'},
        {"output",    required_argument, 0, 'o'},
        {"us-keymap", no_argument,       0, 'u'},
        {"kill",      no_argument,       0, 'k'},
        {"device",    required_argument, 0, 'd'},
        {"help",      no_argument,       0, '?'},
        {"export-keymap", required_argument, &flags, FLAG_EXPORT_KEYMAP},
        {"no-func-keys",  no_argument,       &flags, FLAG_NO_FUNC_KEYS},
        {"no-timestamps", no_argument,       &flags, FLAG_NO_TIMESTAMPS},
        {"post-http",     required_argument, &flags, FLAG_POST_HTTP},
        {"post-irc",      required_argument, &flags, FLAG_POST_IRC},
        {"post-size",     required_argument, &flags, FLAG_POST_SIZE},
        {"no-daemon",     no_argument,       &flags, FLAG_NO_DAEMON},
        {0}
    };

    int c;
    int option_index;

    while ((c = getopt_long(argc, argv, "sm:o:ukd:?", long_options, &option_index)) != -1)
    {
        switch (c)
        {
        case 's': args.start = true;     break;
        case 'm': args.keymap = optarg;  break;
        case 'o': args.logfile = optarg; break;
        case 'u': args.us_keymap = true; break;
        case 'k': args.kill = true;      break;
        case 'd': args.device = optarg;  break;

        case  0:
            args.flags |= flags;
            switch (flags)
            {
            case FLAG_EXPORT_KEYMAP: args.keymap = optarg; break;

            case FLAG_POST_HTTP:
                if (strncmp(optarg, "http://", 7)  != 0)
                    error(EXIT_FAILURE, 0, "HTTP URL must be like \"http://domain:port/script\"");
                args.http_url = optarg;
                break;

            case FLAG_POST_IRC: {
                // optarg string should be like "entity@server:port", now dissect it
                char *main_sep = strrchr(optarg, '@');
                char *port_sep = strrchr(optarg, ':');
                if (main_sep == NULL || port_sep == NULL)
                    error(EXIT_FAILURE, 0, "Invalid IRC FORMAT! Must be: nick_or_channel@server:port. See manual!");
                *main_sep = '\0';                                                 // replace @ with \0 to have entity string that starts at optarg
                *port_sep = '\0';                                                 // replace : with \0 to have server string that starts at main_sep+1
                args.irc_entity = optarg;
                args.irc_server = main_sep + 1;
                args.irc_port = port_sep + 1;
                break;
            }

            case FLAG_POST_SIZE:
                args.post_size = atoi(optarg);
                switch (optarg[strlen(optarg) - 1])                                                 // process any trailing M(egabytes) or K(ilobytes)
                {
                case 'K': case 'k': args.post_size *= 1000;    break;
                case 'M': case 'm': args.post_size *= 1000000; break;
                }
            }
            break;

        case '?': usage(); exit(EXIT_SUCCESS);
        default: usage(); exit(EXIT_FAILURE);
        }
    }             // while

    while(optind < argc)
        error(0, 0, "Non-option argument %s", argv[optind++]);
}